

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exception.hpp
# Opt level: O2

void __thiscall
hta::detail::make_exception<const_char_*,_const_char_*>::operator()
          (make_exception<const_char_*,_const_char_*> *this,stringstream *msg,char *arg,char *args)

{
  std::operator<<((ostream *)(msg + 0x10),arg);
  std::operator<<((ostream *)(msg + 0x10),args);
  return;
}

Assistant:

void operator()(std::stringstream& msg, Arg arg, Args... args)
        {
            msg << arg;
            make_exception<Args...>()(msg, args...);
        }